

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_bitset_container_xor
                (array_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  uint64_t *__dest;
  uint16_t *puVar3;
  bitset_container_t *bits;
  array_container_t *paVar4;
  int iVar5;
  long lVar6;
  
  bits = bitset_container_create();
  iVar5 = src_2->cardinality;
  __dest = bits->words;
  memcpy(__dest,src_2->words,0x2000);
  iVar2 = src_1->cardinality;
  if ((long)iVar2 != 0) {
    puVar3 = src_1->array;
    lVar6 = 0;
    do {
      uVar1 = *(ushort *)((long)puVar3 + lVar6);
      iVar5 = (iVar5 - ((int)(__dest[uVar1 >> 6] >> ((byte)uVar1 & 0x3f)) * 2 & 2U)) + 1;
      __dest[uVar1 >> 6] = __dest[uVar1 >> 6] ^ 1L << ((ulong)uVar1 & 0x3f);
      lVar6 = lVar6 + 2;
    } while ((long)iVar2 * 2 != lVar6);
  }
  bits->cardinality = iVar5;
  if (iVar5 < 0x1001) {
    paVar4 = array_container_from_bitset(bits);
    *dst = paVar4;
    bitset_container_free(bits);
  }
  else {
    *dst = bits;
  }
  return 0x1000 < iVar5;
}

Assistant:

bool array_bitset_container_xor(
    const array_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    bitset_container_t *result = bitset_container_create();
    bitset_container_copy(src_2, result);
    result->cardinality = (int32_t)bitset_flip_list_withcard(
        result->words, result->cardinality, src_1->array, src_1->cardinality);

    // do required type conversions.
    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}